

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O2

void __thiscall
solitaire::events::EventsProcessorTests::ignoreLeftButtonUpOnFoundationPilesFromFirstTo
          (EventsProcessorTests *this,uint pilesToIgnore)

{
  TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
  *this_00;
  TypedExpectation<bool_(const_solitaire::geometry::Position_&)> *this_01;
  uint uVar1;
  PileId local_a4;
  StrictMock<solitaire::colliders::FoundationPileColliderMock> *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  ContextMock *local_90;
  MockSpec<bool_(const_solitaire::geometry::Position_&)> local_88;
  MatcherBase<const_solitaire::geometry::Position_&> local_68;
  _Function_base local_50;
  
  local_90 = &(this->contextMock).super_ContextMock;
  for (uVar1 = 0; pilesToIgnore != uVar1; uVar1 = uVar1 + 1) {
    local_a4.t = uVar1;
    testing::Matcher<solitaire::piles::PileId>::Matcher
              ((Matcher<solitaire::piles::PileId> *)&local_68,&local_a4);
    ContextMock::gmock_getFoundationPileCollider
              ((MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                *)&local_88,local_90,(Matcher<solitaire::piles::PileId> *)&local_68);
    testing::internal::GetWithoutMatchers();
    this_00 = testing::internal::
              MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
              ::InternalExpectedAt
                        ((MockSpec<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                          *)&local_88,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                         ,0x58,"contextMock","getFoundationPileCollider(id)");
    local_a0 = &this->foundationPileColliderMock;
    testing::internal::ReturnRefAction::operator_cast_to_Action
              ((Action<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                *)&local_50,(ReturnRefAction *)&local_a0);
    testing::internal::
    TypedExpectation<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
    ::WillOnce(this_00,(Action<solitaire::colliders::interfaces::FoundationPileCollider_&(solitaire::piles::PileId)>
                        *)&local_50);
    std::_Function_base::~_Function_base(&local_50);
    testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
              ((MatcherBase<solitaire::piles::PileId> *)&local_88.matchers_);
    testing::internal::MatcherBase<solitaire::piles::PileId>::~MatcherBase
              ((MatcherBase<solitaire::piles::PileId> *)&local_68);
    local_68.vtable_ =
         (VTable *)
         testing::internal::MatcherBase<solitaire::geometry::Position_const&>::
         GetVTable<testing::internal::MatcherBase<solitaire::geometry::Position_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
         ::kVTable;
    local_68.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
         (_func_int **)&PTR__MatcherBase_002e9a90;
    colliders::FoundationPileColliderMock::gmock_collidesWithCardsInHand
              (&local_88,&(this->foundationPileColliderMock).super_FoundationPileColliderMock,
               (Matcher<const_solitaire::geometry::Position_&> *)&local_68);
    testing::internal::GetWithoutMatchers();
    this_01 = testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::
              InternalExpectedAt(&local_88,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                                 ,0x5a,"foundationPileColliderMock","collidesWithCardsInHand(_)");
    testing::internal::ReturnAction<bool>::ReturnAction((ReturnAction<bool> *)&local_a0,false);
    testing::internal::ReturnAction::operator_cast_to_Action
              ((Action<bool_(const_solitaire::geometry::Position_&)> *)&local_50,
               (ReturnAction *)&local_a0);
    testing::internal::TypedExpectation<bool_(const_solitaire::geometry::Position_&)>::WillOnce
              (this_01,(Action<bool_(const_solitaire::geometry::Position_&)> *)&local_50);
    std::_Function_base::~_Function_base(&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase
              ((MatcherBase<const_solitaire::geometry::Position_&> *)&local_88.matchers_);
    testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase(&local_68);
  }
  return;
}

Assistant:

void ignoreLeftButtonUpOnFoundationPilesFromFirstTo(unsigned pilesToIgnore) {
        for (PileId id {0}; id < pilesToIgnore; ++id) {
            EXPECT_CALL(contextMock, getFoundationPileCollider(id))
                .WillOnce(ReturnRef(foundationPileColliderMock));
            EXPECT_CALL(foundationPileColliderMock, collidesWithCardsInHand(_))
                .WillOnce(Return(false));
        }
    }